

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrNSImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMAttrNSImpl::setPrefix(DOMAttrNSImpl *this,XMLCh *prefix)

{
  DOMDocument *pDVar1;
  bool bVar2;
  int iVar3;
  XMLCh *pXVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMException *pDVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  XMLCh *str2;
  XMLCh *str2_00;
  XMLCh *str2_01;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  XMLSize_t XVar6;
  XMLSize_t XVar7;
  ulong uVar8;
  MemoryManager *pMVar9;
  undefined4 extraout_var_09;
  MemoryManager *local_3c0;
  DOMDocumentImpl *local_3b0;
  long local_3a0;
  MemoryManager *local_390;
  MemoryManager *local_380;
  DOMDocumentImpl *local_370;
  long local_360;
  MemoryManager *local_350;
  MemoryManager *local_340;
  DOMDocumentImpl *local_330;
  long local_320;
  MemoryManager *local_310;
  DOMDocumentImpl *local_300;
  MemoryManager *local_2f0;
  DOMDocumentImpl *local_2e0;
  long local_2d0;
  MemoryManager *local_2c0;
  MemoryManager *local_2b0;
  DOMDocumentImpl *local_2a0;
  long local_290;
  MemoryManager *local_280;
  undefined1 local_268 [8];
  XMLCh temp [256];
  XMLCh *newName;
  XMLSize_t newQualifiedNameLen;
  XMLSize_t prefixLen;
  XMLCh *xmlnsURI;
  XMLCh *xmlURI;
  XMLCh *xml;
  DOMDocumentImpl *doc;
  XMLCh *xmlns;
  XMLCh *prefix_local;
  DOMAttrNSImpl *this_local;
  
  pXVar4 = DOMNodeImpl::getXmlnsString();
  bVar2 = DOMNodeImpl::isReadOnly(&(this->super_DOMAttrImpl).fNode);
  if (bVar2) {
    pDVar5 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this == (DOMAttrNSImpl *)0x0) {
      local_280 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var,iVar3) == 0) {
        local_290 = 0;
      }
      else {
        local_290 = CONCAT44(extraout_var,iVar3) + -8;
      }
      if (local_290 == 0) {
        local_2b0 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_00,iVar3) == 0) {
          local_2a0 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_2a0 = (DOMDocumentImpl *)(CONCAT44(extraout_var_00,iVar3) + -8);
        }
        local_2b0 = DOMDocumentImpl::getMemoryManager(local_2a0);
      }
      local_280 = local_2b0;
    }
    DOMException::DOMException(pDVar5,7,0,local_280);
    __cxa_throw(pDVar5,&DOMException::typeinfo,DOMException::~DOMException);
  }
  if (((this->fNamespaceURI != (XMLCh *)0x0) && (*this->fNamespaceURI != L'\0')) &&
     (bVar2 = XMLString::equals(this->fLocalName,pXVar4), !bVar2)) {
    if ((prefix == (XMLCh *)0x0) || (*prefix == L'\0')) {
      (this->super_DOMAttrImpl).fName = this->fLocalName;
      this->fPrefix = (XMLCh *)0x0;
    }
    else {
      pDVar1 = (this->super_DOMAttrImpl).fParent.fOwnerDocument;
      if (pDVar1 == (DOMDocument *)0x0) {
        local_300 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_300 = (DOMDocumentImpl *)&pDVar1[-1].super_DOMNode;
      }
      bVar2 = DOMDocumentImpl::isXMLName(local_300,prefix);
      if (!bVar2) {
        pDVar5 = (DOMException *)__cxa_allocate_exception(0x28);
        if (this == (DOMAttrNSImpl *)0x0) {
          local_310 = XMLPlatformUtils::fgMemoryManager;
        }
        else {
          iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
          if (CONCAT44(extraout_var_03,iVar3) == 0) {
            local_320 = 0;
          }
          else {
            local_320 = CONCAT44(extraout_var_03,iVar3) + -8;
          }
          if (local_320 == 0) {
            local_340 = XMLPlatformUtils::fgMemoryManager;
          }
          else {
            iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
            if (CONCAT44(extraout_var_04,iVar3) == 0) {
              local_330 = (DOMDocumentImpl *)0x0;
            }
            else {
              local_330 = (DOMDocumentImpl *)(CONCAT44(extraout_var_04,iVar3) + -8);
            }
            local_340 = DOMDocumentImpl::getMemoryManager(local_330);
          }
          local_310 = local_340;
        }
        DOMException::DOMException(pDVar5,5,0,local_310);
        __cxa_throw(pDVar5,&DOMException::typeinfo,DOMException::~DOMException);
      }
      str2 = DOMNodeImpl::getXmlString();
      str2_00 = DOMNodeImpl::getXmlURIString();
      str2_01 = DOMNodeImpl::getXmlnsURIString();
      bVar2 = XMLString::equals(prefix,str2);
      if (((bVar2) && (bVar2 = XMLString::equals(this->fNamespaceURI,str2_00), !bVar2)) ||
         ((bVar2 = XMLString::equals(prefix,pXVar4), bVar2 &&
          (bVar2 = XMLString::equals(this->fNamespaceURI,str2_01), !bVar2)))) {
        pDVar5 = (DOMException *)__cxa_allocate_exception(0x28);
        if (this == (DOMAttrNSImpl *)0x0) {
          local_350 = XMLPlatformUtils::fgMemoryManager;
        }
        else {
          iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
          if (CONCAT44(extraout_var_05,iVar3) == 0) {
            local_360 = 0;
          }
          else {
            local_360 = CONCAT44(extraout_var_05,iVar3) + -8;
          }
          if (local_360 == 0) {
            local_380 = XMLPlatformUtils::fgMemoryManager;
          }
          else {
            iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
            if (CONCAT44(extraout_var_06,iVar3) == 0) {
              local_370 = (DOMDocumentImpl *)0x0;
            }
            else {
              local_370 = (DOMDocumentImpl *)(CONCAT44(extraout_var_06,iVar3) + -8);
            }
            local_380 = DOMDocumentImpl::getMemoryManager(local_370);
          }
          local_350 = local_380;
        }
        DOMException::DOMException(pDVar5,0xe,0,local_350);
        __cxa_throw(pDVar5,&DOMException::typeinfo,DOMException::~DOMException);
      }
      iVar3 = XMLString::indexOf(prefix,L':');
      if (iVar3 != -1) {
        pDVar5 = (DOMException *)__cxa_allocate_exception(0x28);
        if (this == (DOMAttrNSImpl *)0x0) {
          local_390 = XMLPlatformUtils::fgMemoryManager;
        }
        else {
          iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
          if (CONCAT44(extraout_var_07,iVar3) == 0) {
            local_3a0 = 0;
          }
          else {
            local_3a0 = CONCAT44(extraout_var_07,iVar3) + -8;
          }
          if (local_3a0 == 0) {
            local_3c0 = XMLPlatformUtils::fgMemoryManager;
          }
          else {
            iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
            if (CONCAT44(extraout_var_08,iVar3) == 0) {
              local_3b0 = (DOMDocumentImpl *)0x0;
            }
            else {
              local_3b0 = (DOMDocumentImpl *)(CONCAT44(extraout_var_08,iVar3) + -8);
            }
            local_3c0 = DOMDocumentImpl::getMemoryManager(local_3b0);
          }
          local_390 = local_3c0;
        }
        DOMException::DOMException(pDVar5,0xe,0,local_390);
        __cxa_throw(pDVar5,&DOMException::typeinfo,DOMException::~DOMException);
      }
      pXVar4 = DOMDocumentImpl::getPooledString(local_300,prefix);
      this->fPrefix = pXVar4;
      XVar6 = XMLString::stringLen(prefix);
      XVar7 = XMLString::stringLen(this->fLocalName);
      uVar8 = XVar6 + 1 + XVar7;
      if (uVar8 < 0xff) {
        temp._504_8_ = local_268;
      }
      else {
        pMVar9 = DOMDocumentImpl::getMemoryManager(local_300);
        temp._504_4_ = (*pMVar9->_vptr_MemoryManager[3])(pMVar9,uVar8 * 2);
        temp._508_4_ = extraout_var_09;
      }
      XMLString::copyString((XMLCh *)temp._504_8_,prefix);
      *(undefined2 *)(temp._504_8_ + XVar6 * 2) = 0x3a;
      XMLString::copyString((XMLCh *)(temp._504_8_ + (XVar6 + 1) * 2),this->fLocalName);
      pXVar4 = DOMDocumentImpl::getPooledString(local_300,(XMLCh *)temp._504_8_);
      (this->super_DOMAttrImpl).fName = pXVar4;
      if (0xfe < uVar8) {
        pMVar9 = DOMDocumentImpl::getMemoryManager(local_300);
        (*pMVar9->_vptr_MemoryManager[4])(pMVar9,temp._504_8_);
      }
    }
    return;
  }
  pDVar5 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this == (DOMAttrNSImpl *)0x0) {
    local_2c0 = XMLPlatformUtils::fgMemoryManager;
  }
  else {
    iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
    if (CONCAT44(extraout_var_01,iVar3) == 0) {
      local_2d0 = 0;
    }
    else {
      local_2d0 = CONCAT44(extraout_var_01,iVar3) + -8;
    }
    if (local_2d0 == 0) {
      local_2f0 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar3 = (*(this->super_DOMAttrImpl).super_DOMAttr.super_DOMNode._vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_02,iVar3) == 0) {
        local_2e0 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_2e0 = (DOMDocumentImpl *)(CONCAT44(extraout_var_02,iVar3) + -8);
      }
      local_2f0 = DOMDocumentImpl::getMemoryManager(local_2e0);
    }
    local_2c0 = local_2f0;
  }
  DOMException::DOMException(pDVar5,0xe,0,local_2c0);
  __cxa_throw(pDVar5,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMAttrNSImpl::setPrefix(const XMLCh *prefix)
{
    const XMLCh * xmlns = DOMNodeImpl::getXmlnsString();

    if (fNode.isReadOnly())
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNodeMemoryManager);
    if (fNamespaceURI == 0 || fNamespaceURI[0] == chNull || XMLString::equals(fLocalName, xmlns))
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);

    if (prefix == 0 || prefix[0] == chNull) {
        fName = fLocalName;
        fPrefix = 0;
        return;
    }

    DOMDocumentImpl* doc = (DOMDocumentImpl*) fParent.fOwnerDocument;

    if (!doc->isXMLName(prefix))
        throw DOMException(DOMException::INVALID_CHARACTER_ERR,0, GetDOMNodeMemoryManager);

    const XMLCh * xml = DOMNodeImpl::getXmlString();
    const XMLCh * xmlURI = DOMNodeImpl::getXmlURIString();
    const XMLCh * xmlnsURI = DOMNodeImpl::getXmlnsURIString();

    if ((XMLString::equals(prefix, xml) &&
         !XMLString::equals(fNamespaceURI, xmlURI))
        || (XMLString::equals(prefix, xmlns) &&
            !XMLString::equals(fNamespaceURI, xmlnsURI)))
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);

    if (XMLString::indexOf(prefix, chColon) != -1) {
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
    }

    this-> fPrefix = doc->getPooledString(prefix);

    XMLSize_t prefixLen = XMLString::stringLen(prefix);
    XMLSize_t newQualifiedNameLen = prefixLen+1+XMLString::stringLen(fLocalName);
    XMLCh* newName;
    XMLCh temp[256];
    if (newQualifiedNameLen >= 255)
        newName = (XMLCh*) doc->getMemoryManager()->allocate
        (
            newQualifiedNameLen * sizeof(XMLCh)
        );//new XMLCh[newQualifiedNameLen];
    else
        newName = temp;

    // newName = prefix + chColon + fLocalName;
    XMLString::copyString(newName, prefix);
    newName[prefixLen] = chColon;
    XMLString::copyString(&newName[prefixLen+1], fLocalName);

    fName = doc->getPooledString(newName);

    if (newQualifiedNameLen >= 255)
      doc->getMemoryManager()->deallocate(newName);//delete[] newName;

}